

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O3

FT_Error t1_set_mm_blend(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_String *pFVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  PS_Blend blend;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  
  if (face == (T1_Face)0x0) {
    return 6;
  }
  uVar3 = (ulong)(uint)(face->root).num_faces;
  if (uVar3 == 0) {
    return -1;
  }
  uVar4 = (ulong)*(uint *)((long)&(face->root).num_faces + 4);
  pFVar1 = (face->type1).font_info.full_name;
  uVar6 = 0;
  bVar2 = false;
  do {
    lVar7 = 0x10000;
    if (uVar4 != 0) {
      uVar8 = 0;
      do {
        if (uVar8 < num_coords) {
          uVar5 = 0x10000 - coords[uVar8];
          if (((uint)uVar6 >> ((uint)uVar8 & 0x1f) & 1) != 0) {
            uVar5 = coords[uVar8];
          }
          if ((long)uVar5 < 1) {
            lVar7 = 0;
            break;
          }
          if (uVar5 < 0x10000) {
            lVar7 = (long)(int)(((long)(uVar5 * lVar7) >> 0x3f) + uVar5 * lVar7 + 0x8000 >> 0x10);
          }
        }
        else {
          lVar7 = lVar7 >> 1;
        }
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    if (*(long *)(pFVar1 + uVar6 * 8) != lVar7) {
      *(long *)(pFVar1 + uVar6 * 8) = lVar7;
      bVar2 = true;
    }
    uVar6 = uVar6 + 1;
    if (uVar6 == uVar3) {
      return -(uint)!bVar2;
    }
  } while( true );
}

Assistant:

static FT_Error
  t1_set_mm_blend( T1_Face    face,
                   FT_UInt    num_coords,
                   FT_Fixed*  coords )
  {
    PS_Blend  blend = face->blend;
    FT_UInt   n, m;

    FT_Bool  have_diff = 0;


    if ( !blend )
      return FT_THROW( Invalid_Argument );

    if ( num_coords > blend->num_axis )
      num_coords = blend->num_axis;

    /* recompute the weight vector from the blend coordinates */
    for ( n = 0; n < blend->num_designs; n++ )
    {
      FT_Fixed  result = 0x10000L;  /* 1.0 fixed */
      FT_Fixed  factor;


      for ( m = 0; m < blend->num_axis; m++ )
      {
        /* use a default value if we don't have a coordinate */
        if ( m >= num_coords )
        {
          result >>= 1;
          continue;
        }

        /* get current blend axis position */
        factor = coords[m];
        if ( ( n & ( 1 << m ) ) == 0 )
          factor = 0x10000L - factor;

        if ( factor <= 0 )
        {
          result = 0;
          break;
        }
        else if ( factor >= 0x10000L )
          continue;

        result = FT_MulFix( result, factor );
      }

      if ( blend->weight_vector[n] != result )
      {
        blend->weight_vector[n] = result;
        have_diff               = 1;
      }
    }

    /* return value -1 indicates `no change' */
    return have_diff ? FT_Err_Ok : -1;
  }